

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Person.cpp
# Opt level: O0

void __thiscall SHOPManagement::Person::editAddress(Person *this)

{
  Address *this_00;
  size_type sVar1;
  reference ppAVar2;
  Address *pEdit;
  undefined1 local_c0 [8];
  string address_street;
  undefined1 local_98 [8];
  string address_city;
  undefined1 local_70 [8];
  string address_country;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string address_name;
  int address_index;
  Person *this_local;
  
  sVar1 = std::vector<SHOPManagement::Address_*,_std::allocator<SHOPManagement::Address_*>_>::size
                    (&this->v_adress_list);
  if (sVar1 == 0) {
    std::__cxx11::string::operator=((string *)Helper::m_message_abi_cxx11_,"Please add an address.")
    ;
  }
  else {
    address_name.field_2._12_4_ = getAddressIndex(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_38,"",&local_39);
    std::allocator<char>::~allocator(&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_70,"",(allocator<char> *)(address_city.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(address_city.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_98,"",(allocator<char> *)(address_street.field_2._M_local_buf + 0xf))
    ;
    std::allocator<char>::~allocator((allocator<char> *)(address_street.field_2._M_local_buf + 0xf))
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_c0,"",(allocator<char> *)((long)&pEdit + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&pEdit + 7));
    std::operator<<((ostream *)&std::cout,"Address Name: ");
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)local_38);
    std::operator<<((ostream *)&std::cout,"Country: ");
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)local_70);
    std::operator<<((ostream *)&std::cout,"City: ");
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)local_98);
    std::operator<<((ostream *)&std::cout,"Street: ");
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)local_c0);
    ppAVar2 = std::vector<SHOPManagement::Address_*,_std::allocator<SHOPManagement::Address_*>_>::at
                        (&this->v_adress_list,(long)(int)address_name.field_2._12_4_);
    this_00 = *ppAVar2;
    Address::setName(this_00,(string *)local_38);
    Address::setCountry(this_00,(string *)local_70);
    Address::setCity(this_00,(string *)local_98);
    Address::setStreet(this_00,(string *)local_c0);
    std::__cxx11::string::operator=
              ((string *)Helper::m_message_abi_cxx11_,"Address was successfully updated.");
    std::__cxx11::string::~string((string *)local_c0);
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string((string *)local_38);
  }
  return;
}

Assistant:

void Person::editAddress()
    {
        if (this->v_adress_list.size() < 1)
        {
            Helper::m_message = "Please add an address.";
            return;
        }

        int address_index = this->getAddressIndex();
        std::string address_name = "";
        std::string address_country = "";
        std::string address_city = "";
        std::string address_street = "";

        std::cout << "Address Name: ";
        std::getline(std::cin, address_name);

        std::cout << "Country: ";
        std::getline(std::cin, address_country);

        std::cout << "City: ";
        std::getline(std::cin, address_city);

        std::cout << "Street: ";
        std::getline(std::cin, address_street);

        Address *pEdit = this->v_adress_list.at(address_index);
        pEdit->setName(address_name);
        pEdit->setCountry(address_country);
        pEdit->setCity(address_city);
        pEdit->setStreet(address_street);

        Helper::m_message = "Address was successfully updated.";
    }